

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void NGA_Access64(int g_a,int64_t *lo,int64_t *hi,void *ptr,int64_t *ld)

{
  Integer IVar1;
  long lVar2;
  Integer *ld_00;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer _ga_work [7];
  Integer aIStack_e8 [7];
  long lStack_b0;
  Integer local_a8 [8];
  Integer local_68 [7];
  
  IVar1 = pnga_ndim((long)g_a);
  lVar2 = IVar1;
  if (0 < IVar1) {
    do {
      (&lStack_b0)[lVar2] = *lo + 1;
      lo = lo + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  lVar2 = IVar1;
  if (0 < IVar1) {
    do {
      aIStack_e8[lVar2 + -1] = *hi + 1;
      hi = hi + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  ld_00 = local_68;
  pnga_access_ptr((long)g_a,local_a8,aIStack_e8,ptr,ld_00);
  if (1 < IVar1) {
    do {
      ld[IVar1 + -2] = *ld_00;
      IVar1 = IVar1 + -1;
      ld_00 = ld_00 + 1;
    } while (IVar1 != 1);
  }
  return;
}

Assistant:

void NGA_Access64(int g_a, int64_t lo[], int64_t hi[], void *ptr, int64_t ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
     Integer _ga_work[MAXDIM];
     COPYINDEX_C2F(lo,_ga_lo,ndim);
     COPYINDEX_C2F(hi,_ga_hi,ndim);

     wnga_access_ptr(a,_ga_lo, _ga_hi, ptr, _ga_work);
     COPYF2C_64(_ga_work,ld, ndim-1);
}